

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Parser::_count_nlines(Parser *this,csubstr src)

{
  size_t sVar1;
  csubstr src_local;
  
  src_local.len = (size_t)src.str;
  src_local.str = (char *)this;
  sVar1 = basic_substring<const_char>::count(&src_local,'\n',0);
  return sVar1 + 1;
}

Assistant:

size_t Parser::_count_nlines(csubstr src)
{
    return 1 + src.count('\n');
}